

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-demo.cpp
# Opt level: O2

void __thiscall ExampleAppLog::ExampleAppLog(ExampleAppLog *this)

{
  (this->Buf).Buf.Size = 0;
  (this->Buf).Buf.Capacity = 0;
  (this->Buf).Buf.Data = (char *)0x0;
  ImGuiTextFilter::ImGuiTextFilter(&this->Filter,"");
  (this->LineOffsets).Size = 0;
  (this->LineOffsets).Capacity = 0;
  (this->LineOffsets).Data = (int *)0x0;
  this->AutoScroll = true;
  Clear(this);
  return;
}

Assistant:

ExampleAppLog()
    {
        AutoScroll = true;
        Clear();
    }